

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFloatStateQueryTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::FloatStateQueryVerifiers::GetIntegerVerifier::verifyFloat2Expanded
          (GetIntegerVerifier *this,TestContext *testCtx,GLenum name,GLfloat reference0,
          GLfloat reference1)

{
  ostringstream *this_00;
  bool bVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  Hex<8UL> hex;
  Hex<8UL> hex_00;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  StateQueryMemoryWriteGuard<int[2]> floatVector2;
  undefined1 local_1b0 [384];
  
  lVar2 = (long)((reference0 * 4.2949673e+09 + -1.0) * 0.5);
  uVar4 = lVar2 - 0x3ff;
  if (0x7ffffffe < (long)uVar4) {
    uVar4 = 0x7fffffff;
  }
  if ((long)uVar4 < -0x7fffffff) {
    uVar4 = 0xffffffff80000000;
  }
  lVar5 = (long)((reference1 * 4.2949673e+09 + -1.0) * 0.5);
  uVar7 = lVar5 - 0x3ff;
  if (0x7ffffffe < (long)uVar7) {
    uVar7 = 0x7fffffff;
  }
  if ((long)uVar7 < -0x7fffffff) {
    uVar7 = 0xffffffff80000000;
  }
  uVar3 = lVar2 + 0x3ff;
  if (0x7ffffffe < (long)uVar3) {
    uVar3 = 0x7fffffff;
  }
  if ((long)uVar3 < -0x7fffffff) {
    uVar3 = 0xffffffff80000000;
  }
  uVar6 = lVar5 + 0x3ff;
  if (0x7ffffffe < (long)uVar6) {
    uVar6 = 0x7fffffff;
  }
  if ((long)uVar6 < -0x7fffffff) {
    uVar6 = 0xffffffff80000000;
  }
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int[2]>::StateQueryMemoryWriteGuard
            (&floatVector2);
  glu::CallLogWrapper::glGetIntegerv
            (&(this->super_StateVerifier).super_CallLogWrapper,name,floatVector2.m_value);
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int[2]>::verifyValidity
                    (&floatVector2,testCtx);
  if (bVar1) {
    if (((int)uVar3 < floatVector2.m_value[0] || floatVector2.m_value[0] < (int)uVar4) ||
       ((int)uVar6 < floatVector2.m_value[1] || floatVector2.m_value[1] < (int)uVar7)) {
      local_1b0._0_8_ = testCtx->m_log;
      this_00 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::operator<<((ostream *)this_00,"// ERROR: expected in ranges ");
      std::operator<<((ostream *)this_00,"[");
      tcu::Format::operator<<((ostream *)this_00,(Hex<8UL>)(uVar4 & 0xffffffff));
      std::operator<<((ostream *)this_00," ");
      tcu::Format::operator<<((ostream *)this_00,(Hex<8UL>)(uVar3 & 0xffffffff));
      std::operator<<((ostream *)this_00,"], ");
      std::operator<<((ostream *)this_00,"[");
      tcu::Format::operator<<((ostream *)this_00,(Hex<8UL>)(uVar7 & 0xffffffff));
      std::operator<<((ostream *)this_00," ");
      tcu::Format::operator<<((ostream *)this_00,(Hex<8UL>)(uVar6 & 0xffffffff));
      std::operator<<((ostream *)this_00,"]");
      std::operator<<((ostream *)this_00,"; got ");
      hex.value._4_4_ = 0;
      hex.value._0_4_ = floatVector2.m_value[0];
      tcu::Format::operator<<((ostream *)this_00,hex);
      std::operator<<((ostream *)this_00,", ");
      hex_00.value._4_4_ = 0;
      hex_00.value._0_4_ = floatVector2.m_value[1];
      tcu::Format::operator<<((ostream *)this_00,hex_00);
      std::operator<<((ostream *)this_00," ");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this_00);
      if (testCtx->m_testResult == QP_TEST_RESULT_PASS) {
        tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid integer value");
      }
    }
  }
  return;
}

Assistant:

GLint64 expandGLFloatToInteger (GLfloat f)
{
	const GLuint64 referenceValue = (GLint64)((f * double(0xFFFFFFFFULL) - 1) / 2);
	return referenceValue;
}